

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O0

char * bech32_strerror(bech32_error error_code)

{
  char *local_18;
  char *result;
  bech32_error error_code_local;
  
  if (((int)error_code < 0) || (5 < (int)error_code)) {
    local_18 = bech32_errordesc[1];
  }
  else {
    local_18 = bech32_errordesc[error_code];
  }
  return local_18;
}

Assistant:

const char * bech32_strerror(bech32_error error_code) {
    const char * result = "";
    if(error_code >= E_BECH32_SUCCESS && error_code < E_BECH32_MAX_ERROR) {
        result = bech32_errordesc[error_code];
    }
    else
        result = bech32_errordesc[E_BECH32_UNKNOWN_ERROR];
    return result;
}